

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftgrays.c
# Opt level: O0

int gray_convert_glyph(gray_PWorker worker)

{
  int iVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  TCoord **ppTVar6;
  int local_40d4;
  int local_40cc;
  int error;
  TCoord w;
  TCoord width;
  int continued;
  TCoord *band;
  TCoord bands [32];
  int local_402c;
  TCoord y;
  size_t n;
  size_t height;
  TCell buffer [682];
  TCoord yMax;
  TCoord yMin;
  gray_PWorker worker_local;
  
  local_402c = worker->min_ey;
  iVar1 = worker->max_ey;
  n._0_4_ = iVar1 - local_402c;
  uVar4 = (ulong)(int)n;
  w = 0;
  worker->cell_null = (PCell_conflict)&buffer[0x2a8].next;
  worker->cell_null->x = 0x7fffffff;
  worker->cell_null->area = 0;
  worker->cell_null->cover = 0;
  worker->cell_null->next = (PCell)0x0;
  worker->ycells = (PCell_conflict *)&height;
  if (0x55 < uVar4) {
    uVar5 = (uVar4 + 0x54) / 0x55;
    n._0_4_ = (int)(((uVar4 + uVar5) - 1) / uVar5);
  }
  do {
    if (iVar1 <= local_402c) {
      return 0;
    }
    worker->min_ey = local_402c;
    local_402c = local_402c + (int)n;
    local_40d4 = iVar1;
    if (local_402c < iVar1) {
      local_40d4 = local_402c;
    }
    worker->max_ey = local_40d4;
    _width = &band;
    band._4_4_ = worker->min_ey;
    band._0_4_ = worker->max_ey;
    do {
      iVar2 = *(int *)_width - *(int *)((long)_width + 4);
      for (local_40cc = 0; local_40cc < iVar2; local_40cc = local_40cc + 1) {
        worker->ycells[local_40cc] = worker->cell_null;
      }
      worker->cell_free = (PCell_conflict)&buffer[((long)iVar2 * 8 + 0x17U) / 0x18 - 1].next;
      worker->cell = worker->cell_null;
      worker->min_ey = *(int *)((long)_width + 4);
      worker->max_ey = *(int *)_width;
      worker->count_ey = iVar2;
      iVar3 = gray_convert_glyph_inner(worker,w);
      w = 1;
      if (iVar3 == 0) {
        if (worker->render_span == (FT_SpanFunc)0x0) {
          gray_sweep(worker);
        }
        else {
          gray_sweep_direct(worker);
        }
        _width = (TCoord **)((long)_width + -4);
      }
      else {
        if (iVar3 != 0x62) {
          return iVar3;
        }
        if (iVar2 >> 1 == 0) {
          return 0x62;
        }
        ppTVar6 = (TCoord **)((long)_width + 4);
        *(int *)(_width + 1) = *(int *)ppTVar6;
        *(int *)ppTVar6 = (iVar2 >> 1) + *(int *)ppTVar6;
        _width = ppTVar6;
      }
    } while (&band <= _width);
  } while( true );
}

Assistant:

static int
  gray_convert_glyph( RAS_ARG )
  {
    const TCoord  yMin = ras.min_ey;
    const TCoord  yMax = ras.max_ey;

    TCell    buffer[FT_MAX_GRAY_POOL];
    size_t   height = (size_t)( yMax - yMin );
    size_t   n = FT_MAX_GRAY_POOL / 8;
    TCoord   y;
    TCoord   bands[32];  /* enough to accommodate bisections */
    TCoord*  band;

    int  continued = 0;


    /* Initialize the null cell at the end of the poll. */
    ras.cell_null        = buffer + FT_MAX_GRAY_POOL - 1;
    ras.cell_null->x     = CELL_MAX_X_VALUE;
    ras.cell_null->area  = 0;
    ras.cell_null->cover = 0;
    ras.cell_null->next  = NULL;

    /* set up vertical bands */
    ras.ycells     = (PCell*)buffer;

    if ( height > n )
    {
      /* two divisions rounded up */
      n       = ( height + n - 1 ) / n;
      height  = ( height + n - 1 ) / n;
    }

    for ( y = yMin; y < yMax; )
    {
      ras.min_ey = y;
      y         += height;
      ras.max_ey = FT_MIN( y, yMax );

      band    = bands;
      band[1] = ras.min_ey;
      band[0] = ras.max_ey;

      do
      {
        TCoord  width = band[0] - band[1];
        TCoord  w;
        int     error;


        for ( w = 0; w < width; ++w )
          ras.ycells[w] = ras.cell_null;

        /* memory management: skip ycells */
        n = ( (size_t)width * sizeof ( PCell ) + sizeof ( TCell ) - 1 ) /
              sizeof ( TCell );

        ras.cell_free = buffer + n;
        ras.cell      = ras.cell_null;
        ras.min_ey    = band[1];
        ras.max_ey    = band[0];
        ras.count_ey  = width;

        error     = gray_convert_glyph_inner( RAS_VAR_ continued );
        continued = 1;

        if ( !error )
        {
          if ( ras.render_span )  /* for FT_RASTER_FLAG_DIRECT only */
            gray_sweep_direct( RAS_VAR );
          else
            gray_sweep( RAS_VAR );
          band--;
          continue;
        }
        else if ( error != Smooth_Err_Raster_Overflow )
          return error;

        /* render pool overflow; we will reduce the render band by half */
        width >>= 1;

        /* this should never happen even with tiny rendering pool */
        if ( width == 0 )
        {
          FT_TRACE7(( "gray_convert_glyph: rotten glyph\n" ));
          return FT_THROW( Raster_Overflow );
        }

        band++;
        band[1]  = band[0];
        band[0] += width;
      } while ( band >= bands );
    }

    return Smooth_Err_Ok;
  }